

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_instance.cpp
# Opt level: O1

void __thiscall
embree::Instance::convertToDeviceRepresentation
          (Instance *this,size_t offset,char *data_host,char *data_device)

{
  char *__dest;
  undefined8 *puVar1;
  AffineSpace3ff *pAVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  Scene *pSVar10;
  long lVar11;
  ulong uVar12;
  
  __dest = data_host + offset;
  memcpy(__dest,this,0xb0);
  if ((this->super_Geometry).numTimeSteps != 0) {
    lVar11 = 0;
    uVar12 = 0;
    do {
      pAVar2 = this->local2world;
      puVar1 = (undefined8 *)((long)&(pAVar2->l).vx.field_0 + lVar11);
      uVar3 = *puVar1;
      uVar4 = puVar1[1];
      puVar1 = (undefined8 *)((long)&(pAVar2->l).vy.field_0 + lVar11);
      uVar5 = *puVar1;
      uVar6 = puVar1[1];
      puVar1 = (undefined8 *)((long)&(pAVar2->l).vz.field_0 + lVar11);
      uVar7 = *puVar1;
      uVar8 = puVar1[1];
      puVar1 = (undefined8 *)((long)&(pAVar2->p).field_0 + lVar11);
      uVar9 = puVar1[1];
      *(undefined8 *)(data_host + lVar11 + offset + 0xe0) = *puVar1;
      *(undefined8 *)(data_host + lVar11 + offset + 0xe0 + 8) = uVar9;
      *(undefined8 *)(data_host + lVar11 + offset + 0xd0) = uVar7;
      *(undefined8 *)(data_host + lVar11 + offset + 0xd0 + 8) = uVar8;
      *(undefined8 *)(data_host + lVar11 + offset + 0xc0) = uVar5;
      *(undefined8 *)(data_host + lVar11 + offset + 0xc0 + 8) = uVar6;
      *(undefined8 *)(data_host + lVar11 + offset + 0xb0) = uVar3;
      *(undefined8 *)(data_host + lVar11 + offset + 0xb0 + 8) = uVar4;
      uVar12 = uVar12 + 1;
      lVar11 = lVar11 + 0x40;
    } while (uVar12 < (this->super_Geometry).numTimeSteps);
  }
  pSVar10 = Scene::getTraversable(*(Scene **)(__dest + 0x58));
  *(Scene **)(__dest + 0x58) = pSVar10;
  *(char **)(__dest + 0x60) = data_device + offset + 0xb0;
  return;
}

Assistant:

void Instance::convertToDeviceRepresentation(size_t offset, char* data_host, char* data_device) const {
    // save offset for later when overriding local2world with device ptr
    size_t offsetInstance = offset;

    std::memcpy(data_host + offsetInstance, (void*)this, sizeof(Instance));
    offset += sizeof(Instance);
    for (size_t t = 0; t < numTimeSteps; ++t) {
      std::memcpy(data_host + offset, &(local2world[t]), sizeof(AffineSpace3ff));
      offset += sizeof(AffineSpace3ff);
    }

    // override local2world value with device ptr in geometry_data_host
    Instance* instance = (Instance*)(data_host + offsetInstance);
    instance->object = ((Scene*)(instance->object))->getTraversable();
    instance->local2world = (AffineSpace3ff*)(data_device + offsetInstance + sizeof(Instance));
  }